

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelOverridesProperties::~IfcRelOverridesProperties
          (IfcRelOverridesProperties *this,void **vtt)

{
  void **vtt_local;
  IfcRelOverridesProperties *this_local;
  
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = *vtt;
  *(void **)(&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines + -0x18)
            ) = vtt[0x19];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 = vtt[0x1a];
  (this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0xc0 = vtt[0x1c];
  *(void **)&(this->super_IfcRelDefinesByProperties).field_0xd8 = vtt[0x1d];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
             &(this->super_IfcRelDefinesByProperties).field_0xe8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelOverridesProperties,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelOverridesProperties,_1UL> *)
             &(this->super_IfcRelDefinesByProperties).field_0xd8,vtt + 0x17);
  IfcRelDefinesByProperties::~IfcRelDefinesByProperties
            (&this->super_IfcRelDefinesByProperties,vtt + 1);
  return;
}

Assistant:

IfcRelOverridesProperties() : Object("IfcRelOverridesProperties") {}